

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall
leveldb::DBTest_FilesDeletedAfterCompaction_Test::TestBody
          (DBTest_FilesDeletedAfterCompaction_Test *this)

{
  DB *pDVar1;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar2;
  _Alloc_hider _Var3;
  pointer pcVar4;
  char *pcVar5;
  int iVar6;
  AssertionResult gtest_ar;
  int num_files;
  undefined1 local_b1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  pointer pcStack_a8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [16];
  AssertHelper local_90;
  undefined8 uStack_88;
  undefined1 local_80 [16];
  AssertHelper local_70;
  _Alloc_hider _Stack_68;
  int local_5c;
  undefined1 local_58 [16];
  pointer local_48;
  int local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_b0._M_head_impl = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"foo","");
  local_90.data_ = (AssertHelperData *)local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
  local_58[0] = '\0';
  local_70.data_ = (AssertHelperData *)local_b0._M_head_impl;
  _Stack_68._M_p = pcStack_a8;
  local_40 = (int)local_90.data_;
  uStack_3c = local_90.data_._4_4_;
  uStack_38 = (undefined4)uStack_88;
  uStack_34 = uStack_88._4_4_;
  (*((this->super_DBTest).db_)->_vptr_DB[2])(local_58 + 8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_70,
             (char *)&local_40,(Status *)"Put(\"foo\", \"v2\")");
  if ((void *)CONCAT71(local_58._9_7_,local_58[8]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_58._9_7_,local_58[8]));
  }
  if (local_90.data_ != (AssertHelperData *)local_80) {
    operator_delete(local_90.data_);
  }
  if (local_b0._M_head_impl != local_a0) {
    operator_delete(local_b0._M_head_impl);
  }
  PVar2 = local_70.data_._0_1_;
  if (local_70.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (_Stack_68._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)_Stack_68._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x74a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  _Var3._M_p = _Stack_68._M_p;
  if (_Stack_68._M_p != (pointer)0x0) {
    if (*_Stack_68._M_p != _Stack_68._M_p + 0x10) {
      operator_delete(*_Stack_68._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  if (PVar2 != (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x186f3f;
    pcStack_a8 = (pointer)0x1;
    local_90.data_ = (AssertHelperData *)0x17b712;
    uStack_88 = 1;
    pDVar1 = (this->super_DBTest).db_;
    (*pDVar1->_vptr_DB[0xb])(pDVar1,&local_b0,(string *)&local_90);
    local_5c = DBTest::CountFiles(&this->super_DBTest);
    iVar6 = 10;
    do {
      local_b0._M_head_impl = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"foo","");
      local_90.data_ = (AssertHelperData *)local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v2","");
      pDVar1 = (this->super_DBTest).db_;
      local_b1 = 0;
      local_70.data_ = (AssertHelperData *)local_b0._M_head_impl;
      _Stack_68._M_p = pcStack_a8;
      local_40 = (int)local_90.data_;
      uStack_3c = local_90.data_._4_4_;
      uStack_38 = (undefined4)uStack_88;
      uStack_34 = uStack_88._4_4_;
      (*pDVar1->_vptr_DB[2])(local_58,pDVar1,&local_b1,&local_70,&local_40);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_58 + 8),
                 (char *)&local_70,(Status *)"Put(\"foo\", \"v2\")");
      if ((void *)CONCAT71(local_58._1_7_,local_58[0]) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_58._1_7_,local_58[0]));
      }
      if (local_90.data_ != (AssertHelperData *)local_80) {
        operator_delete(local_90.data_);
      }
      if (local_b0._M_head_impl != local_a0) {
        operator_delete(local_b0._M_head_impl);
      }
      pcVar4 = local_48;
      if (local_58[8] == '\0') {
        testing::Message::Message((Message *)&local_b0);
        if (local_48 == (pointer)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x74e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        pcVar4 = local_48;
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
          pcVar4 = local_48;
        }
        goto LAB_0012d613;
      }
      if (local_48 != (pointer)0x0) {
        if (*(pointer *)local_48 != local_48 + 0x10) {
          operator_delete(*(pointer *)local_48);
        }
        operator_delete(pcVar4);
      }
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x186f3f;
      pcStack_a8 = (pointer)0x1;
      local_90.data_ = (AssertHelperData *)0x17b712;
      uStack_88 = 1;
      pDVar1 = (this->super_DBTest).db_;
      (*pDVar1->_vptr_DB[0xb])(pDVar1,&local_b0,(string *)&local_90);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar6 = DBTest::CountFiles(&this->super_DBTest);
    local_90.data_._0_4_ = iVar6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_b0,"CountFiles()","num_files",(int *)&local_90,&local_5c);
    pcVar4 = pcStack_a8;
    if (local_b0._M_head_impl._0_1_ == (string)0x0) {
      testing::Message::Message((Message *)&local_90);
      if (pcStack_a8 == (pointer)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)pcStack_a8;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x751,pcVar5);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      pcVar4 = pcStack_a8;
      if (local_90.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_90.data_ + 8))();
        pcVar4 = pcStack_a8;
      }
    }
LAB_0012d613:
    if (pcVar4 != (pointer)0x0) {
      if (*(pointer *)pcVar4 != pcVar4 + 0x10) {
        operator_delete(*(pointer *)pcVar4);
      }
      operator_delete(pcVar4);
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, FilesDeletedAfterCompaction) {
  ASSERT_LEVELDB_OK(Put("foo", "v2"));
  Compact("a", "z");
  const int num_files = CountFiles();
  for (int i = 0; i < 10; i++) {
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    Compact("a", "z");
  }
  ASSERT_EQ(CountFiles(), num_files);
}